

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVec2 *p;
  double *pdVar1;
  double dVar2;
  bool bVar3;
  short sVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  ImVec2 IVar7;
  ImVec2 IVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ImGuiContext *pIVar11;
  bool bVar12;
  ImGuiWindow **ppIVar13;
  ImGuiWindow *pIVar14;
  long lVar15;
  undefined1 uVar16;
  uint uVar17;
  byte bVar18;
  int iVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  int iVar23;
  ulong uVar24;
  byte bVar25;
  ulong uVar26;
  ImGuiWindow *pIVar27;
  float fVar28;
  float fVar31;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ImGuiWindow *local_90;
  ImGuiViewportP *local_88;
  ImRect local_78;
  ImVec2 local_68;
  undefined8 uStack_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImRect local_40;
  
  pIVar11 = GImGui;
  local_58 = (GImGui->Style).TouchExtraPadding;
  auVar29._8_8_ = 0;
  auVar29._0_4_ = local_58.x;
  auVar29._4_4_ = local_58.y;
  auVar29 = maxps(auVar29,_DAT_001c2720);
  GImGui->WindowsHoverPadding = auVar29._0_8_;
  pIVar14 = pIVar11->MovingWindow;
  if (pIVar14 == (ImGuiWindow *)0x0) {
    local_88 = (ImGuiViewportP *)0x0;
    pIVar27 = (ImGuiWindow *)0x0;
  }
  else {
    local_88 = pIVar14->Viewport;
    pIVar14->Viewport = pIVar11->MouseViewport;
    pIVar27 = (ImGuiWindow *)0x0;
    if ((pIVar14->Flags & 0x200) == 0) {
      pIVar27 = pIVar14;
    }
    local_58 = (pIVar11->Style).TouchExtraPadding;
  }
  local_68 = local_58;
  if ((pIVar11->IO).ConfigWindowsResizeFromEdges == true) {
    local_68 = pIVar11->WindowsHoverPadding;
  }
  uStack_60 = 0;
  p = &(pIVar11->IO).MousePos;
  local_90 = (ImGuiWindow *)0x0;
  uStack_50 = 0;
  iVar19 = (pIVar11->Windows).Size;
LAB_00144a9a:
  do {
    do {
      iVar23 = iVar19;
      if (iVar23 < 1) {
LAB_00144c18:
        pIVar11->HoveredWindow = pIVar27;
        pIVar11->HoveredWindowUnderMovingWindow = local_90;
        pIVar14 = pIVar11->MovingWindow;
        if (pIVar14 != (ImGuiWindow *)0x0) {
          pIVar14->Viewport = local_88;
        }
        if ((pIVar27 != pIVar14 && pIVar27 != (ImGuiWindow *)0x0) &&
           (pIVar27->Viewport != pIVar11->MouseViewport)) {
          __assert_fail("g.HoveredWindow == __null || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x10f2,"void ImGui::UpdateHoveredWindowAndCaptureFlags()");
        }
        pIVar14 = GetTopMostPopupModal();
        if (pIVar14 == (ImGuiWindow *)0x0 || pIVar27 == (ImGuiWindow *)0x0) {
          bVar12 = false;
        }
        else {
          bVar12 = IsWindowWithinBeginStackOf(pIVar27->RootWindow,pIVar14);
          bVar12 = !bVar12;
        }
        uVar17 = (pIVar11->IO).ConfigFlags;
        iVar19 = (pIVar11->OpenPopupStack).Size;
        uVar24 = 0xffffffffffffffff;
        uVar26 = 0;
        bVar20 = 0;
        while( true ) {
          iVar23 = (int)uVar24;
          if (uVar26 == 5) break;
          if ((pIVar11->IO).MouseClicked[uVar26] == true) {
            (pIVar11->IO).MouseDownOwned[uVar26] = pIVar27 != (ImGuiWindow *)0x0 || 0 < iVar19;
            (pIVar11->IO).MouseDownOwnedUnlessPopupClose[uVar26] =
                 pIVar27 != (ImGuiWindow *)0x0 || pIVar14 != (ImGuiWindow *)0x0;
          }
          bVar3 = (pIVar11->IO).MouseDown[uVar26];
          if ((bVar3 == true) &&
             ((iVar23 == -1 ||
              (dVar2 = (pIVar11->IO).MouseClickedTime[iVar23],
              pdVar1 = (pIVar11->IO).MouseClickedTime + uVar26, *pdVar1 <= dVar2 && dVar2 != *pdVar1
              )))) {
            uVar24 = uVar26 & 0xffffffff;
          }
          bVar20 = bVar20 & 1 | bVar3;
          uVar26 = uVar26 + 1;
        }
        bVar18 = 1;
        bVar22 = 1;
        bVar21 = 1;
        if (iVar23 != -1) {
          bVar22 = (pIVar11->IO).MouseDownOwned[iVar23];
          bVar21 = (pIVar11->IO).MouseDownOwnedUnlessPopupClose[iVar23];
        }
        bVar25 = (byte)((uVar17 & 0x10) >> 4) | bVar12;
        if (pIVar11->DragDropActive == true) {
          bVar18 = (pIVar11->DragDropSourceFlags & 0x10U) == 0 | bVar25;
        }
        if (bVar22 != 0) {
          bVar18 = bVar25;
        }
        if (bVar18 != 0) {
          pIVar11->HoveredWindow = (ImGuiWindow *)0x0;
          pIVar11->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
          pIVar27 = (ImGuiWindow *)0x0;
        }
        if (pIVar11->WantCaptureMouseNextFrame == -1) {
          bVar20 = pIVar27 != (ImGuiWindow *)0x0 | bVar20;
          (pIVar11->IO).WantCaptureMouse = (bool)(bVar22 & bVar20 | 0 < iVar19);
          bVar20 = bVar21 & bVar20 | pIVar14 != (ImGuiWindow *)0x0;
          lVar15 = 0x3660;
        }
        else {
          bVar20 = pIVar11->WantCaptureMouseNextFrame != 0;
          (pIVar11->IO).WantCaptureMouseUnlessPopupClose = (bool)bVar20;
          lVar15 = 0xd8;
        }
        (&pIVar11->Initialized)[lVar15] = (bool)bVar20;
        if (pIVar11->WantCaptureKeyboardNextFrame == -1) {
          bVar12 = pIVar11->ActiveId != 0 || pIVar14 != (ImGuiWindow *)0x0;
        }
        else {
          bVar12 = pIVar11->WantCaptureKeyboardNextFrame != 0;
        }
        uVar17 = uVar17 & 9;
        uVar16 = (char)uVar17;
        if (uVar17 != 1) {
          uVar16 = bVar12;
        }
        if ((pIVar11->IO).NavActive == false) {
          uVar16 = bVar12;
        }
        (pIVar11->IO).WantCaptureKeyboard = (bool)uVar16;
        (pIVar11->IO).WantTextInput = pIVar11->WantTextInputNextFrame - 1U < 0xfffffffe;
        return;
      }
      iVar19 = iVar23 + -1;
      ppIVar13 = ImVector<ImGuiWindow_*>::operator[](&pIVar11->Windows,iVar19);
      auVar10._8_8_ = uStack_50;
      auVar10._0_4_ = local_58.x;
      auVar10._4_4_ = local_58.y;
      pIVar14 = *ppIVar13;
    } while (((pIVar14->Active != true) || (pIVar14->Hidden != false)) ||
            ((pIVar14->Flags & 0x200) != 0));
    if (pIVar14->Viewport == (ImGuiViewportP *)0x0) {
      __assert_fail("window->Viewport",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x1484,"void FindHoveredWindow()");
    }
  } while (pIVar14->Viewport != pIVar11->MouseViewport);
  IVar7 = (pIVar14->OuterRectClipped).Min;
  IVar8 = (pIVar14->OuterRectClipped).Max;
  uVar17 = (uint)((pIVar14->Flags & 0x1000042U) == 0);
  auVar30._0_4_ = (int)(uVar17 << 0x1f) >> 0x1f;
  auVar30._4_4_ = (int)(uVar17 << 0x1f) >> 0x1f;
  auVar30._8_8_ = 0;
  auVar9._8_8_ = uStack_60;
  auVar9._0_4_ = local_68.x;
  auVar9._4_4_ = local_68.y;
  auVar29 = ~auVar30 & auVar10 | auVar9 & auVar30;
  fVar28 = auVar29._0_4_;
  fVar31 = auVar29._4_4_;
  auVar5._4_8_ = SUB168(auVar9 & auVar30,8);
  auVar5._0_4_ = fVar31;
  auVar32._0_8_ = auVar5._0_8_ << 0x20;
  auVar32._8_4_ = fVar28;
  auVar32._12_4_ = fVar31;
  local_78.Min.x = IVar7.x;
  local_78.Min.y = IVar7.y;
  local_78.Max.x = IVar8.x;
  local_78.Max.y = IVar8.y;
  auVar6._4_8_ = auVar32._8_8_;
  auVar6._0_4_ = fVar31 + local_78.Min.y;
  auVar33._0_8_ = auVar6._0_8_ << 0x20;
  auVar33._8_4_ = fVar28 + local_78.Max.x;
  auVar33._12_4_ = fVar31 + local_78.Max.y;
  local_78.Min.x = local_78.Min.x - fVar28;
  local_78.Min.y = local_78.Min.y - fVar31;
  local_78.Max = auVar33._8_8_;
  bVar12 = ImRect::Contains(&local_78,p);
  if (bVar12) {
    sVar4 = (pIVar14->HitTestHoleSize).x;
    if (sVar4 != 0) {
      auVar29 = pshuflw(ZEXT416((uint)pIVar14->HitTestHoleOffset),
                        ZEXT416((uint)pIVar14->HitTestHoleOffset),0x60);
      local_40.Min.x = (float)(auVar29._0_4_ >> 0x10) + (pIVar14->Pos).x;
      local_40.Min.y = (float)(auVar29._4_4_ >> 0x10) + (pIVar14->Pos).y;
      local_40.Max.x = (float)(int)sVar4 + local_40.Min.x;
      local_40.Max.y =
           (float)(int)((long)((ulong)(ushort)(pIVar14->HitTestHoleSize).y << 0x30) >> 0x30) +
           local_40.Min.y;
      bVar12 = ImRect::Contains(&local_40,p);
      if (bVar12) goto LAB_00144a9a;
    }
    if (pIVar27 == (ImGuiWindow *)0x0) {
      pIVar27 = pIVar14;
    }
    if (((local_90 == (ImGuiWindow *)0x0) &&
        (local_90 = pIVar14, pIVar11->MovingWindow != (ImGuiWindow *)0x0)) &&
       (pIVar14->RootWindowDockTree == pIVar11->MovingWindow->RootWindowDockTree)) {
      local_90 = (ImGuiWindow *)0x0;
    }
    else {
      if (pIVar27 != (ImGuiWindow *)0x0) goto LAB_00144c18;
      pIVar27 = (ImGuiWindow *)0x0;
    }
  }
  iVar19 = iVar23 + -1;
  goto LAB_00144a9a;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    g.WindowsHoverPadding = ImMax(g.Style.TouchExtraPadding, ImVec2(WINDOWS_HOVER_PADDING, WINDOWS_HOVER_PADDING));

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();
    IM_ASSERT(g.HoveredWindow == NULL || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport);

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredWindow && !IsWindowWithinBeginStackOf(g.HoveredWindow->RootWindow, modal_window)) // FIXME-MERGE: RootWindowDockTree ?
        clear_hovered_windows = true;

    // Disabled mouse?
    if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and
    // won't report hovering nor request capture even while dragging over our windows afterward.
    const bool has_open_popup = (g.OpenPopupStack.Size > 0);
    const bool has_open_modal = (modal_window != NULL);
    int mouse_earliest_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(io.MouseDown); i++)
    {
        if (io.MouseClicked[i])
        {
            io.MouseDownOwned[i] = (g.HoveredWindow != NULL) || has_open_popup;
            io.MouseDownOwnedUnlessPopupClose[i] = (g.HoveredWindow != NULL) || has_open_modal;
        }
        mouse_any_down |= io.MouseDown[i];
        if (io.MouseDown[i])
            if (mouse_earliest_down == -1 || io.MouseClickedTime[i] < io.MouseClickedTime[mouse_earliest_down])
                mouse_earliest_down = i;
    }
    const bool mouse_avail = (mouse_earliest_down == -1) || io.MouseDownOwned[mouse_earliest_down];
    const bool mouse_avail_unless_popup_close = (mouse_earliest_down == -1) || io.MouseDownOwnedUnlessPopupClose[mouse_earliest_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to Dear ImGui only, false = dispatch mouse to Dear ImGui + underlying app)
    // Update io.WantCaptureMouseAllowPopupClose (experimental) to give a chance for app to react to popup closure with a drag
    if (g.WantCaptureMouseNextFrame != -1)
    {
        io.WantCaptureMouse = io.WantCaptureMouseUnlessPopupClose = (g.WantCaptureMouseNextFrame != 0);
    }
    else
    {
        io.WantCaptureMouse = (mouse_avail && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_popup;
        io.WantCaptureMouseUnlessPopupClose = (mouse_avail_unless_popup_close && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_modal;
    }

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to Dear ImGui only, false = dispatch keyboard info to Dear ImGui + underlying app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        io.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        io.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (io.NavActive && (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(io.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        io.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    io.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}